

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

gc_table * __thiscall
mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
          (gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *this)

{
  gc_table *pgVar1;
  gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *this_local;
  
  pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table,_true>
           ::dereference(&this->table_,this->heap_);
  return pgVar1;
}

Assistant:

gc_table& tab() const { return table_.dereference(heap_); }